

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vertex.cpp
# Opt level: O1

void __thiscall Vertex::mutateVertex(Vertex *this)

{
  pointer pcVar1;
  pointer piVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  bool bVar10;
  string temp_seq;
  long *local_30 [2];
  long local_20 [2];
  
  pcVar1 = (this->seq)._M_dataplus._M_p;
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_30,pcVar1,pcVar1 + (this->seq)._M_string_length);
  iVar3 = (int)(this->seq)._M_string_length;
  if (this->treshhold < 6) {
    if (0 < iVar3) {
      iVar3 = 0;
      bVar10 = false;
      do {
        piVar2 = (this->qual_list).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar5 = (uint)((ulong)((long)(this->qual_list).super__Vector_base<int,_std::allocator<int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)piVar2) >> 2
                      );
        if ((int)uVar5 < 1) {
          iVar4 = -1;
        }
        else {
          if (bVar10) break;
          iVar6 = this->quality;
          uVar7 = 0xffffffff;
          uVar9 = 0;
          do {
            iVar4 = piVar2[uVar9];
            if (iVar4 < iVar6) {
              piVar2[uVar9] = 100;
              uVar7 = uVar9 & 0xffffffff;
              iVar6 = iVar4;
            }
            iVar4 = (int)uVar7;
            uVar9 = uVar9 + 1;
          } while ((uVar5 & 0x7fffffff) != uVar9);
        }
        if (bVar10) break;
        bVar10 = iVar4 != -1;
        if (bVar10) {
          *(undefined1 *)((long)local_30[0] + (long)iVar4) = 0x58;
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 < (int)(this->seq)._M_string_length);
    }
  }
  else if (0 < iVar3) {
    iVar3 = 0;
    iVar4 = 0;
    do {
      piVar2 = (this->qual_list).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = (uint)((ulong)((long)(this->qual_list).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)piVar2) >> 2);
      if ((int)uVar5 < 1) {
        iVar6 = -1;
      }
      else {
        if (iVar4 == 2) break;
        iVar8 = this->quality;
        uVar7 = 0xffffffff;
        uVar9 = 0;
        do {
          iVar6 = piVar2[uVar9];
          if (iVar6 < iVar8) {
            piVar2[uVar9] = 100;
            uVar7 = uVar9 & 0xffffffff;
            iVar8 = iVar6;
          }
          iVar6 = (int)uVar7;
          uVar9 = uVar9 + 1;
        } while ((uVar5 & 0x7fffffff) != uVar9);
      }
      if (iVar4 == 2) break;
      if (iVar6 != -1) {
        *(undefined1 *)((long)local_30[0] + (long)iVar6) = 0x58;
        iVar4 = iVar4 + 1;
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < (int)(this->seq)._M_string_length);
  }
  std::__cxx11::string::_M_assign((string *)&this->seq_del);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return;
}

Assistant:

void Vertex::mutateVertex(){
    string temp_seq = this->seq;
    int min_index = 0, min = 0, count = 0;
    if(this->treshhold > 5){
        count = 0;
        for(int i = 0; i < (int)this->seq.size(); i++){
            min = this->quality, min_index = -1;
            for(int j = 0; j < (int)this->qual_list.size(); j++){
                if(count == 2)
                    break;
                if(this->qual_list[j] < min){
                    min = this->qual_list[j];
                    min_index = j;
                    this->qual_list[j] = 100;
                }
            }
            if(count == 2)
                break;
            if(min_index == -1)
                continue;
            temp_seq[min_index] = 'X';
            count++;
        }
        this->seq_del = temp_seq;
        return void();
    }else{
        count = 0;
        for(int i = 0; i < (int)this->seq.size(); i++){
            min = this->quality, min_index = -1;
            for(int j = 0; j < (int)this->qual_list.size(); j++){
                if(count)
                    break;
                if(this->qual_list[j] < min){
                    min = this->qual_list[j];
                    min_index = j;
                    this->qual_list[j] = 100;
                }
            }
            if(count)
                break;
            if(min_index == -1)
                continue;
            temp_seq[min_index] = 'X';
            count++;
        }
    }
    this->seq_del = temp_seq;
    return void();
}